

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::setWinId(QWidgetPrivate *this,WId id)

{
  WId WVar1;
  WId in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  WId oldWinId;
  QEvent e;
  QWidget *q;
  unsigned_long_long *in_stack_ffffffffffffffa8;
  undefined1 *local_20;
  undefined1 *local_18;
  QWidget *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = q_func(in_RDI);
  if ((mapper != (QWidgetMapper *)0x0) && ((in_RDI->data).winid != 0)) {
    QHash<unsigned_long_long,_QWidget_*>::remove(mapper,(char *)&in_RDI->data);
  }
  WVar1 = (in_RDI->data).winid;
  (in_RDI->data).winid = in_RSI;
  if ((mapper != (QWidgetMapper *)0x0) && (in_RSI != 0)) {
    QHash<unsigned_long_long,_QWidget_*>::insert
              ((QHash<unsigned_long_long,_QWidget_*> *)in_RDI,in_stack_ffffffffffffffa8,
               (QWidget **)0x3613dd);
  }
  if (WVar1 != in_RSI) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_20,WinIdChange);
    QCoreApplication::sendEvent(&local_10->super_QObject,(QEvent *)&local_20);
    QEvent::~QEvent((QEvent *)&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setWinId(WId id)                // set widget identifier
{
    Q_Q(QWidget);
    if (mapper && data.winid) {
        mapper->remove(data.winid);
    }

    const WId oldWinId = data.winid;

    data.winid = id;
    if (mapper && id) {
        mapper->insert(data.winid, q);
    }

    if (oldWinId != id) {
        QEvent e(QEvent::WinIdChange);
        QCoreApplication::sendEvent(q, &e);
    }
}